

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall
kratos::GeneratorDebugVisitor::visit(GeneratorDebugVisitor *this,Generator *generator)

{
  __node_base_ptr *this_00;
  iterator iVar1;
  undefined1 local_b0 [8];
  DebugInfoVisitor visitor;
  
  iVar1 = std::_Rb_tree<$6f46ab9c$>::find(&(this->result_)._M_t,&generator->name);
  if (((_Rb_tree_header *)iVar1._M_node == &(this->result_)._M_t._M_impl.super__Rb_tree_header) &&
     ((generator->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (generator->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_b0 = (undefined1  [8])&PTR_visit_root_002afd88;
    visitor.result_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&visitor.result_;
    visitor.result_._M_t._M_impl._0_4_ = 0;
    visitor.result_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    visitor.result_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    visitor.result_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    this_00 = &visitor.super_IRVisitor.visited_._M_h._M_single_bucket;
    visitor.result_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    visitor.result_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         visitor.result_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>
    ::
    _M_emplace_unique<int,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>&>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>
                *)this_00,
               (int *)((long)&visitor.result_._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
               &(generator->super_IRNode).fn_name_ln);
    IRVisitor::visit_content((IRVisitor *)local_b0,generator);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<unsigned_int,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<unsigned_int,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<unsigned_int,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string&,std::map<unsigned_int,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<unsigned_int,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<unsigned_int,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<unsigned_int,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>>>>>
                *)&this->result_,&generator->name,
               (map<unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
                *)this_00);
    local_b0 = (undefined1  [8])&PTR_visit_root_002afd88;
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
                 *)this_00);
    local_b0 = (undefined1  [8])&PTR_visit_root_002ad270;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&visitor.super_IRVisitor.level);
  }
  return;
}

Assistant:

void visit(Generator *generator) override {
        if (result_.find(generator->name) != result_.end()) return;
        if (!generator->fn_name_ln.empty()) {
            DebugInfoVisitor visitor;
            visitor.result().emplace(1, generator->fn_name_ln);
            visitor.visit_content(generator);
            result_.emplace(generator->name, visitor.result());
        }
    }